

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.c
# Opt level: O1

_Bool is_same_type(json_value *value,config_item *item)

{
  json_type jVar1;
  
  if (value == (json_value *)0x0) {
    return false;
  }
  jVar1 = value->type;
  if ((jVar1 == json_boolean) && (item->type == cdt_bool)) {
    return true;
  }
  if (jVar1 == json_integer) {
    if ((item->type == cdt_uint16) && ((ulong)(value->u).integer < 0x10000)) {
      return true;
    }
    if (item->type == cdt_int) {
      return true;
    }
  }
  switch(jVar1) {
  case json_object:
    break;
  case json_array:
    goto switchD_00105f49_caseD_2;
  default:
    return false;
  case json_double:
    if (item->type == cdt_double) {
      return true;
    }
    if (jVar1 != json_object) {
      if (jVar1 == json_array) goto switchD_00105f49_caseD_2;
      if (jVar1 != json_string) {
        return false;
      }
      goto switchD_00105f49_caseD_5;
    }
    break;
  case json_string:
switchD_00105f49_caseD_5:
    if (item->type == cdt_string) {
      return true;
    }
    if (jVar1 == json_array) goto switchD_00105f49_caseD_2;
    if (jVar1 != json_object) {
      return false;
    }
  }
  if (item->type == cdt_object) {
    return true;
  }
  if (jVar1 != json_array) {
    return false;
  }
switchD_00105f49_caseD_2:
  return item->list;
}

Assistant:

static bool is_same_type(json_value * value, config_item * item)
{
    if (value == NULL || item == NULL)
        return false;

    return (value->type == json_boolean && item->type == cdt_bool)
        || (value->type == json_integer && item->type == cdt_uint16
            && value->u.integer >=0 && value->u.integer < 0x10000)
        || (value->type == json_integer && item->type == cdt_int)
        || (value->type == json_double && item->type == cdt_double)
        || (value->type == json_string && item->type == cdt_string)
        || (value->type == json_object && item->type == cdt_object)
        || (value->type == json_array && item->list == true);
}